

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmwindow.cpp
# Opt level: O1

void __thiscall QEglFSKmsGbmWindow::resetSurface(QEglFSKmsGbmWindow *this)

{
  void *pvVar1;
  QEglFSKmsGbmIntegration *pQVar2;
  char cVar3;
  QEglFSKmsGbmScreen *this_00;
  QSurfaceFormat *pQVar4;
  gbm_surface *pgVar5;
  char *pcVar6;
  char *pcVar7;
  code *pcVar8;
  long lVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  QSurfaceFormat platformFormat;
  int local_78 [6];
  undefined8 local_60;
  QList<int> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QEglFSKmsGbmScreen *)(**(code **)(*(long *)this + 0x18))();
  pvVar1 = *(void **)&this_00->field_0x10;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  pQVar2 = this->m_integration;
  QPlatformWindow::window();
  QWindow::requestedFormat();
  (**(code **)(*(long *)pQVar2 + 0x90))((QSurfaceFormat *)&local_40,pQVar2,local_78);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_78);
  pQVar4 = (QSurfaceFormat *)
           QEglFSDeviceIntegration::chooseConfig(pvVar1,(QSurfaceFormat *)&local_40);
  *(QSurfaceFormat **)&this->field_0x48 = pQVar4;
  q_glFormatFromConfig(local_78,pvVar1,pQVar4);
  QSurfaceFormat::operator=((QSurfaceFormat *)&this->field_0x50,(QSurfaceFormat *)local_78);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_78);
  pgVar5 = QEglFSKmsGbmScreen::createSurface(this_00,*(EGLConfig *)&this->field_0x48);
  *(gbm_surface **)&this->field_0x40 = pgVar5;
  pcVar8 = (code *)0x0;
  pcVar6 = (char *)eglQueryString(0,0x3055);
  if (pcVar6 != (char *)0x0) {
    pcVar7 = strstr(pcVar6,"EGL_KHR_platform_gbm");
    if (pcVar7 == (char *)0x0) {
      pcVar6 = strstr(pcVar6,"EGL_MESA_platform_gbm");
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (code *)0x0;
        goto LAB_00114c78;
      }
    }
    pcVar8 = (code *)eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT");
  }
LAB_00114c78:
  if (pcVar8 == (code *)0x0) {
    lVar9 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar9 + 0x10) & 1) != 0) {
      local_60 = *(undefined8 *)(lVar9 + 8);
      local_78[0] = 2;
      local_78[1] = 0;
      local_78[2] = 0;
      local_78[3] = 0;
      local_78[4] = 0;
      local_78[5] = 0;
      QMessageLogger::debug
                ((char *)local_78,
                 "No eglCreatePlatformWindowSurface for GBM, falling back to eglCreateWindowSurface"
                );
    }
    uVar10 = eglCreateWindowSurface
                       (pvVar1,*(undefined8 *)&this->field_0x48,*(undefined8 *)&this->field_0x40,0);
    *(undefined8 *)&this->field_0x38 = uVar10;
  }
  else {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (int *)0x0;
    local_58.d.size = 0;
    cVar3 = QSurfaceFormat::testOption((FormatOption)&local_40);
    if (cVar3 != '\0') {
      cVar3 = q_hasEglExtension(pvVar1,"EGL_EXT_protected_content");
      if (cVar3 == '\0') {
        QSurfaceFormat::setOption((FormatOption)&this->field_0x50,true);
      }
      else {
        local_78[0] = 0x32c0;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_58,local_58.d.size,local_78);
        QList<int>::end(&local_58);
        local_78[0] = 1;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_58,local_58.d.size,local_78);
        QList<int>::end(&local_58);
        lVar9 = QtPrivateLogging::qLcEglfsKmsDebug();
        if ((*(byte *)(lVar9 + 0x10) & 1) != 0) {
          local_60 = *(undefined8 *)(lVar9 + 8);
          local_78[0] = 2;
          local_78[1] = 0;
          local_78[2] = 0;
          local_78[3] = 0;
          local_78[4] = 0;
          local_78[5] = 0;
          QMessageLogger::debug
                    ((char *)local_78,
                     "Enabled EGL_PROTECTED_CONTENT_EXT for eglCreatePlatformWindowSurfaceEXT");
        }
      }
    }
    local_78[0] = 0x3038;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_58,local_58.d.size,local_78);
    QList<int>::end(&local_58);
    uVar10 = (*pcVar8)(pvVar1,*(undefined8 *)&this->field_0x48,*(undefined8 *)&this->field_0x40,
                       local_58.d.ptr);
    *(undefined8 *)&this->field_0x38 = uVar10;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmWindow::resetSurface()
{
    QEglFSKmsGbmScreen *gbmScreen = static_cast<QEglFSKmsGbmScreen *>(screen());
    EGLDisplay display = gbmScreen->display();
    QSurfaceFormat platformFormat = m_integration->surfaceFormatFor(window()->requestedFormat());
    m_config = QEglFSDeviceIntegration::chooseConfig(display, platformFormat);
    m_format = q_glFormatFromConfig(display, m_config, platformFormat);
    // One fullscreen window per screen -> the native window is simply the gbm_surface the screen created.
    m_window = reinterpret_cast<EGLNativeWindowType>(gbmScreen->createSurface(m_config));

    PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC createPlatformWindowSurface = nullptr;
    const char *extensions = eglQueryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
    if (extensions && (strstr(extensions, "EGL_KHR_platform_gbm") || strstr(extensions, "EGL_MESA_platform_gbm"))) {
        createPlatformWindowSurface = reinterpret_cast<PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC>(
            eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT"));
    }

    if (createPlatformWindowSurface) {
        QVector<EGLint> contextAttributes;
#ifdef EGL_EXT_protected_content
        if (platformFormat.testOption(QSurfaceFormat::ProtectedContent)) {
            if (q_hasEglExtension(display, "EGL_EXT_protected_content")) {
                contextAttributes.append(EGL_PROTECTED_CONTENT_EXT);
                contextAttributes.append(EGL_TRUE);
                qCDebug(qLcEglfsKmsDebug, "Enabled EGL_PROTECTED_CONTENT_EXT for eglCreatePlatformWindowSurfaceEXT");
            } else {
                m_format.setOption(QSurfaceFormat::ProtectedContent, false);
            }
        }
#endif
        contextAttributes.append(EGL_NONE);

        m_surface = createPlatformWindowSurface(display, m_config, reinterpret_cast<void *>(m_window), contextAttributes.constData());
    } else {
        qCDebug(qLcEglfsKmsDebug, "No eglCreatePlatformWindowSurface for GBM, falling back to eglCreateWindowSurface");
        m_surface = eglCreateWindowSurface(display, m_config, m_window, nullptr);
    }
}